

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

uchar * jpgd::decompress_jpeg_image_from_stream
                  (jpeg_decoder_stream *pStream,int *width,int *height,int *actual_comps,
                  int req_comps)

{
  uchar uVar1;
  int iVar2;
  uchar *p;
  uint8 *puVar3;
  uchar *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uchar *puVar9;
  uint8 *pScan_line;
  size_t local_3598;
  uint scan_line_len;
  jpeg_decoder decoder;
  
  if (((actual_comps == (int *)0x0) ||
      (*actual_comps = 0,
      (req_comps == 0 || height == (int *)0x0) ||
      (width == (int *)0x0 || pStream == (jpeg_decoder_stream *)0x0))) || (4 < (uint)req_comps)) {
    return (uchar *)0x0;
  }
  if ((0x1aU >> (req_comps & 0x1fU) & 1) == 0) {
    return (uchar *)0x0;
  }
  jpeg_decoder::jpeg_decoder(&decoder,pStream);
  if (decoder.m_error_code == JPGD_SUCCESS) {
    *width = decoder.m_image_x_size;
    *height = decoder.m_image_y_size;
    *actual_comps = decoder.m_comps_in_frame;
    iVar2 = jpeg_decoder::begin_decoding(&decoder);
    if (iVar2 == 0) {
      p = (uchar *)crnlib::crnlib_malloc
                             ((long)(decoder.m_image_x_size * req_comps * decoder.m_image_y_size));
      uVar8 = 0;
      if (p != (uchar *)0x0) {
        local_3598 = (size_t)(decoder.m_image_x_size * req_comps);
        uVar7 = (ulong)(uint)decoder.m_image_x_size;
        if (decoder.m_image_x_size < 1) {
          uVar7 = uVar8;
        }
        uVar5 = (ulong)(uint)decoder.m_image_y_size;
        if (decoder.m_image_y_size < 1) {
          uVar5 = uVar8;
        }
        puVar9 = p;
        for (; uVar8 != uVar5; uVar8 = uVar8 + 1) {
          iVar2 = jpeg_decoder::decode(&decoder,&pScan_line,&scan_line_len);
          if (iVar2 != 0) {
            crnlib::crnlib_free(p);
            goto LAB_0011b61c;
          }
          if (req_comps == 4) {
            if (decoder.m_comps_in_frame == 1) {
LAB_0011b74e:
              uVar6 = 0;
              puVar3 = pScan_line;
              if (req_comps == 3) {
                for (; uVar7 * 3 != uVar6; uVar6 = uVar6 + 3) {
                  uVar1 = *puVar3;
                  puVar9[uVar6] = uVar1;
                  puVar9[uVar6 + 1] = uVar1;
                  puVar9[uVar6 + 2] = uVar1;
                  puVar3 = puVar3 + 1;
                }
              }
              else {
                for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
                  uVar1 = pScan_line[uVar6];
                  puVar9[uVar6 * 4] = uVar1;
                  puVar9[uVar6 * 4 + 1] = uVar1;
                  puVar9[uVar6 * 4 + 2] = uVar1;
                  puVar9[uVar6 * 4 + 3] = 0xff;
                }
              }
            }
            else if (decoder.m_comps_in_frame == 3) goto LAB_0011b726;
          }
          else if (req_comps == 1) {
            if (decoder.m_comps_in_frame == 1) {
LAB_0011b726:
              memcpy(p + uVar8 * local_3598,pScan_line,local_3598);
            }
            else if (decoder.m_comps_in_frame == 3) {
              for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
                puVar9[uVar6] =
                     (uchar)((uint)pScan_line[uVar6 * 4 + 2] * 0x1d2f +
                             (uint)pScan_line[uVar6 * 4 + 1] * 0x9646 +
                             (uint)pScan_line[uVar6 * 4] * 0x4c8b + 0x8000 >> 0x10);
              }
            }
          }
          else if (decoder.m_comps_in_frame == 3) {
            puVar4 = pScan_line + 2;
            for (uVar6 = 0; uVar7 * 3 != uVar6; uVar6 = uVar6 + 3) {
              puVar9[uVar6] = puVar4[-2];
              puVar9[uVar6 + 1] = puVar4[-1];
              puVar9[uVar6 + 2] = *puVar4;
              puVar4 = puVar4 + 4;
            }
          }
          else if (decoder.m_comps_in_frame == 1) goto LAB_0011b74e;
          puVar9 = puVar9 + local_3598;
        }
        goto LAB_0011b61f;
      }
    }
  }
LAB_0011b61c:
  p = (uchar *)0x0;
LAB_0011b61f:
  jpeg_decoder::~jpeg_decoder(&decoder);
  return p;
}

Assistant:

unsigned char* decompress_jpeg_image_from_stream(jpeg_decoder_stream* pStream, int* width, int* height, int* actual_comps, int req_comps) {
  if (!actual_comps)
    return NULL;
  *actual_comps = 0;

  if ((!pStream) || (!width) || (!height) || (!req_comps))
    return NULL;

  if ((req_comps != 1) && (req_comps != 3) && (req_comps != 4))
    return NULL;

  jpeg_decoder decoder(pStream);
  if (decoder.get_error_code() != JPGD_SUCCESS)
    return NULL;

  const int image_width = decoder.get_width(), image_height = decoder.get_height();
  *width = image_width;
  *height = image_height;
  *actual_comps = decoder.get_num_components();

  if (decoder.begin_decoding() != JPGD_SUCCESS)
    return NULL;

  const int dst_bpl = image_width * req_comps;

  uint8* pImage_data = (uint8*)jpgd_malloc(dst_bpl * image_height);
  if (!pImage_data)
    return NULL;

  for (int y = 0; y < image_height; y++) {
    const uint8* pScan_line;
    uint scan_line_len;
    if (decoder.decode((const void**)&pScan_line, &scan_line_len) != JPGD_SUCCESS) {
      jpgd_free(pImage_data);
      return NULL;
    }

    uint8* pDst = pImage_data + y * dst_bpl;

    if (((req_comps == 1) && (decoder.get_num_components() == 1)) || ((req_comps == 4) && (decoder.get_num_components() == 3)))
      memcpy(pDst, pScan_line, dst_bpl);
    else if (decoder.get_num_components() == 1) {
      if (req_comps == 3) {
        for (int x = 0; x < image_width; x++) {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst += 3;
        }
      } else {
        for (int x = 0; x < image_width; x++) {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst[3] = 255;
          pDst += 4;
        }
      }
    } else if (decoder.get_num_components() == 3) {
      if (req_comps == 1) {
        const int YR = 19595, YG = 38470, YB = 7471;
        for (int x = 0; x < image_width; x++) {
          int r = pScan_line[x * 4 + 0];
          int g = pScan_line[x * 4 + 1];
          int b = pScan_line[x * 4 + 2];
          *pDst++ = static_cast<uint8>((r * YR + g * YG + b * YB + 32768) >> 16);
        }
      } else {
        for (int x = 0; x < image_width; x++) {
          pDst[0] = pScan_line[x * 4 + 0];
          pDst[1] = pScan_line[x * 4 + 1];
          pDst[2] = pScan_line[x * 4 + 2];
          pDst += 3;
        }
      }
    }
  }

  return pImage_data;
}